

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int on_frame_recv(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  undefined1 *puVar1;
  long lVar2;
  HTTP *pHVar3;
  undefined8 *puVar4;
  RTSP *pRVar5;
  CURL_conflict *newhandle;
  int iVar6;
  uint32_t uVar7;
  int32_t iVar8;
  CURLUcode CVar9;
  CURLcode CVar10;
  int iVar11;
  CURLMcode CVar12;
  Curl_easy *data;
  size_t sVar13;
  FILEPROTO *pFVar14;
  CURLU *u;
  char *pcVar15;
  stream_ctx *psVar16;
  uint stream_id;
  Curl_easy *pCVar17;
  void *pvVar18;
  ulong uVar19;
  bool bVar20;
  Curl_easy *second;
  stream_ctx *newstream;
  char buffer [256];
  Curl_easy *local_158;
  CURL_conflict *local_150;
  stream_ctx *local_148;
  stream_ctx *local_140;
  curl_pushheaders local_138 [16];
  
  lVar2 = *(long *)((long)userp + 0x10);
  if (userp == (void *)0x0) {
    pCVar17 = (Curl_easy *)0x0;
  }
  else {
    pCVar17 = *(Curl_easy **)(lVar2 + 0x10);
  }
  stream_id = (frame->hd).stream_id;
  if ((((pCVar17 != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
      ((*(ulong *)&(pCVar17->set).field_0x8ba & 0x10000000) != 0)) && (0 < *(int *)(*userp + 0xc)))
  {
    iVar6 = fr_print(frame,(char *)local_138,(size_t)userp);
    *(undefined1 *)((long)&local_138[0].data + (long)iVar6) = 0;
    if ((((pCVar17->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(pCVar17,(Curl_cfilter *)userp,"[%d] <- %s",
                        (ulong)(uint)(frame->hd).stream_id,local_138);
    }
  }
  if (stream_id == 0) {
    if ((frame->hd).type == '\a') {
      *(byte *)(lVar2 + 200) = *(byte *)(lVar2 + 200) | 2;
      *(int32_t *)(lVar2 + 0xc0) = (frame->priority).pri_spec.weight;
      *(int32_t *)(lVar2 + 0xc4) = (frame->priority).pri_spec.stream_id;
      if (pCVar17 != (Curl_easy *)0x0) {
        if (((pCVar17->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(pCVar17,"received GOAWAY, error=%d, last_stream=%u");
        }
        Curl_multi_connchanged(pCVar17->multi);
        return 0;
      }
      return 0;
    }
    if ((frame->hd).type != '\x04') {
      return 0;
    }
    if (((frame->hd).flags & 1) != 0) {
      return 0;
    }
    iVar6 = *(int *)(lVar2 + 8);
    uVar7 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
    *(uint32_t *)(lVar2 + 8) = uVar7;
    uVar7 = nghttp2_session_get_remote_settings(session,NGHTTP2_SETTINGS_ENABLE_PUSH);
    *(byte *)(lVar2 + 200) = *(byte *)(lVar2 + 200) & 0xfb | (uVar7 != 0) << 2;
    if (pCVar17 != (Curl_easy *)0x0) {
      if (((userp != (void *)0x0) && ((*(ulong *)&(pCVar17->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(pCVar17,(Curl_cfilter *)userp,"[0] MAX_CONCURRENT_STREAMS: %d",
                          (ulong)*(uint *)(lVar2 + 8));
      }
      if (((userp != (void *)0x0) && ((*(ulong *)&(pCVar17->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        pcVar15 = "TRUE";
        if ((*(byte *)(lVar2 + 200) & 4) == 0) {
          pcVar15 = "false";
        }
        Curl_trc_cf_infof(pCVar17,(Curl_cfilter *)userp,"[0] ENABLE_PUSH: %s",pcVar15);
      }
      if (iVar6 != *(int *)(lVar2 + 8)) {
        if (((userp != (void *)0x0) && ((*(ulong *)&(pCVar17->set).field_0x8ba & 0x10000000) != 0))
           && (0 < *(int *)(*userp + 0xc))) {
          Curl_trc_cf_infof(pCVar17,(Curl_cfilter *)userp,"[0] notify MAX_CONCURRENT_STREAMS: %u");
        }
        Curl_multi_connchanged(pCVar17->multi);
      }
    }
    if (((pCVar17->req).keepon & 0x2aU) == 2) {
      if ((pCVar17 == (Curl_easy *)0x0) || (pHVar3 = (pCVar17->req).p.http, pHVar3 == (HTTP *)0x0))
      {
        psVar16 = (stream_ctx *)0x0;
      }
      else {
        psVar16 = (stream_ctx *)pHVar3->h2_ctx;
      }
      if (psVar16 != (stream_ctx *)0x0) {
        drain_stream((Curl_cfilter *)userp,pCVar17,psVar16);
        return 0;
      }
      return 0;
    }
    return 0;
  }
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  if (data == (Curl_easy *)0x0) {
    if (pCVar17 == (Curl_easy *)0x0) {
      return 0;
    }
    if (userp == (void *)0x0) {
      return 0;
    }
    if ((*(ulong *)&(pCVar17->set).field_0x8ba & 0x10000000) == 0) {
      return 0;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return 0;
    }
    pcVar15 = "[%d] No Curl_easy associated";
    iVar6 = 0;
LAB_0063e953:
    Curl_trc_cf_infof(pCVar17,(Curl_cfilter *)userp,pcVar15,(ulong)stream_id);
    return iVar6;
  }
  pHVar3 = (data->req).p.http;
  if (pHVar3 == (HTTP *)0x0) {
    psVar16 = (stream_ctx *)0x0;
  }
  else {
    psVar16 = (stream_ctx *)pHVar3->h2_ctx;
  }
  stream_id = (frame->hd).stream_id;
  if (psVar16 == (stream_ctx *)0x0) {
    iVar6 = -0x386;
    if (userp == (void *)0x0) {
      return -0x386;
    }
    if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
      return -0x386;
    }
    if (*(int *)(*userp + 0xc) < 1) {
      return -0x386;
    }
    pcVar15 = "[%d] No stream_ctx set";
    pCVar17 = data;
    goto LAB_0063e953;
  }
  if (8 < (frame->hd).type) {
    return 0;
  }
  puVar4 = *(undefined8 **)((long)userp + 0x10);
  switch((frame->hd).type) {
  case '\0':
    sVar13 = Curl_bufq_len(&psVar16->recvbuf);
    if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
       (0 < *(int *)(*userp + 0xc))) {
      iVar8 = nghttp2_session_get_stream_effective_recv_data_length
                        ((nghttp2_session *)*puVar4,psVar16->id);
      local_150 = (CURL_conflict *)CONCAT44(local_150._4_4_,iVar8);
      iVar8 = nghttp2_session_get_stream_effective_local_window_size
                        ((nghttp2_session *)*puVar4,psVar16->id);
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] DATA, buffered=%zu, window=%d/%d",
                        (ulong)stream_id,sVar13,(ulong)local_150 & 0xffffffff,iVar8);
    }
    if (psVar16->bodystarted == false) {
      iVar6 = nghttp2_submit_rst_stream((nghttp2_session *)*puVar4,'\0',stream_id,1);
      iVar6 = nghttp2_is_fatal(iVar6);
      if (iVar6 != 0) {
        return -0x386;
      }
    }
    if (((frame->hd).flags & 1) == 0) {
      if (sVar13 <= psVar16->local_window_size) {
        return 0;
      }
      uVar7 = nghttp2_session_get_stream_local_window_size((nghttp2_session *)*puVar4,psVar16->id);
      if ((int)uVar7 < 1) {
        return 0;
      }
      if (uVar7 != psVar16->local_window_size) {
        nghttp2_session_set_local_window_size
                  ((nghttp2_session *)*puVar4,'\0',psVar16->id,psVar16->local_window_size);
        return 0;
      }
      return 0;
    }
    break;
  case '\x01':
    if (psVar16->bodystarted != false) {
      return 0;
    }
    if (psVar16->status_code == -1) {
      return -0x386;
    }
    if (99 < psVar16->status_code - 100U) {
      psVar16->bodystarted = true;
      psVar16->status_code = -1;
    }
    CVar10 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x8799bb,(char *)0x2,0x88f330);
    if (CVar10 != CURLE_OK) {
      return -0x386;
    }
    if (99 < psVar16->status_code - 100U) {
      psVar16->resp_hds_complete = true;
    }
    break;
  default:
    goto switchD_0063e806_caseD_2;
  case '\x03':
    psVar16->closed = true;
    if ((frame->priority).pri_spec.stream_id != 0) {
      psVar16->reset = true;
    }
    psVar16->send_closed = true;
    break;
  case '\x05':
    if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
       (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] PUSH_PROMISE received");
    }
    if (data->multi->push_cb == (curl_push_callback)0x0) {
      if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ignore it");
      }
      goto LAB_0063edd0;
    }
    local_158 = curl_easy_duphandle(data);
    if (local_158 != (CURL_conflict *)0x0) {
      pFVar14 = (FILEPROTO *)(*Curl_ccalloc)(1,0x70);
      if (pFVar14 == (FILEPROTO *)0x0) {
        Curl_close(&local_158);
      }
      else {
        (local_158->req).p.file = pFVar14;
        http2_data_setup((Curl_cfilter *)userp,local_158,&local_140);
        (local_158->state).priority.weight = (data->state).priority.weight;
      }
    }
    pCVar17 = local_158;
    if (local_158 == (CURL_conflict *)0x0) {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"failed to duplicate handle");
      }
      goto LAB_0063edd0;
    }
    local_138[0].data = data;
    local_138[0].frame = (nghttp2_push_promise *)frame;
    if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
       (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"Got PUSH_PROMISE, ask application");
    }
    pRVar5 = (data->req).p.rtsp;
    if (pRVar5 == (RTSP *)0x0) {
      pvVar18 = (void *)0x0;
    }
    else {
      pvVar18 = (pRVar5->http_wrapper).h2_ctx;
    }
    if (pvVar18 == (void *)0x0) {
      Curl_failf(data,"Internal NULL stream");
    }
    else {
      local_150 = pCVar17;
      local_158 = (CURL_conflict *)0x0;
      u = curl_url();
      if (u == (CURLU *)0x0) {
        iVar6 = 5;
        pCVar17 = local_150;
      }
      else {
        pcVar15 = curl_pushheader_byname(local_138,":scheme");
        if (pcVar15 == (char *)0x0) {
LAB_0063ec82:
          pcVar15 = curl_pushheader_byname(local_138,":authority");
          if ((pcVar15 == (char *)0x0) ||
             (CVar9 = Curl_url_set_authority(u,pcVar15,0x20), CVar9 == CURLUE_OK)) {
            pcVar15 = curl_pushheader_byname(local_138,":path");
            if ((pcVar15 == (char *)0x0) ||
               (CVar9 = curl_url_set(u,CURLUPART_PATH,pcVar15,0), CVar9 == CURLUE_OK)) {
              CVar9 = curl_url_get(u,CURLUPART_URL,(char **)&local_158,0);
              bVar20 = CVar9 == CURLUE_OK;
              iVar6 = (uint)!bVar20 << 2;
            }
            else {
              bVar20 = false;
              iVar6 = 3;
            }
          }
          else {
            iVar6 = 2;
            bVar20 = false;
          }
        }
        else {
          iVar6 = 1;
          bVar20 = false;
          CVar9 = curl_url_set(u,CURLUPART_SCHEME,pcVar15,0);
          if (CVar9 == CURLUE_OK) goto LAB_0063ec82;
        }
        curl_url_cleanup(u);
        pCVar17 = local_150;
        if (bVar20) {
          if (((local_150->state).field_0x74e & 1) != 0) {
            (*Curl_cfree)((local_150->state).url);
          }
          puVar1 = &(pCVar17->state).field_0x74e;
          *puVar1 = *puVar1 | 1;
          (pCVar17->state).url = (char *)local_158;
          iVar6 = 0;
        }
      }
      if (iVar6 == 0) {
        CVar10 = http2_data_setup((Curl_cfilter *)userp,pCVar17,&local_148);
        if (CVar10 == CURLE_OK) {
          Curl_set_in_callback(data,true);
          iVar6 = (*data->multi->push_cb)
                            (data,pCVar17,*(size_t *)((long)pvVar18 + 0x130),local_138,
                             data->multi->push_userp);
          Curl_set_in_callback(data,false);
          if (*(long *)((long)pvVar18 + 0x130) != 0) {
            uVar19 = 0;
            do {
              (*Curl_cfree)(*(void **)(*(long *)((long)pvVar18 + 0x128) + uVar19 * 8));
              uVar19 = uVar19 + 1;
            } while (uVar19 < *(ulong *)((long)pvVar18 + 0x130));
          }
          (*Curl_cfree)(*(void **)((long)pvVar18 + 0x128));
          newhandle = local_150;
          *(undefined1 (*) [16])((long)pvVar18 + 0x128) = (undefined1  [16])0x0;
          pCVar17 = local_150;
          if (iVar6 == 0) {
            local_148->id = (frame->push_promise).promised_stream_id;
            *(undefined4 *)&(local_150->req).size = 0xffffffff;
            *(undefined4 *)((long)&(local_150->req).size + 4) = 0xffffffff;
            *(undefined4 *)&(local_150->req).maxdownload = 0xffffffff;
            *(undefined4 *)((long)&(local_150->req).maxdownload + 4) = 0xffffffff;
            CVar12 = Curl_multi_add_perform
                               (data->multi,local_150,*(connectdata **)((long)userp + 0x18));
            if (CVar12 == CURLM_OK) {
              iVar6 = nghttp2_session_set_stream_user_data
                                ((nghttp2_session *)*puVar4,local_148->id,newhandle);
              if (iVar6 == 0) {
                return 0;
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"failed to set user_data for stream %u",(ulong)(uint)local_148->id);
              }
            }
            else {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"failed to add handle to multi");
              }
              discard_newhandle((Curl_cfilter *)userp,newhandle);
            }
            goto LAB_0063edd0;
          }
        }
        else {
          Curl_failf(data,"error setting up stream: %d",(ulong)CVar10);
        }
      }
    }
    discard_newhandle((Curl_cfilter *)userp,pCVar17);
LAB_0063edd0:
    iVar6 = nghttp2_submit_rst_stream
                      ((nghttp2_session *)*puVar4,'\0',(frame->push_promise).promised_stream_id,8);
    iVar11 = nghttp2_is_fatal(iVar6);
    if (iVar11 == 0) {
      if (iVar6 != 2) {
        return 0;
      }
      if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] fail in PUSH_PROMISE received",
                          (ulong)stream_id);
      }
    }
    return -0x386;
  case '\b':
    if (((data->req).keepon & 0x2aU) != 2) {
      return 0;
    }
  }
  drain_stream((Curl_cfilter *)userp,data,psVar16);
switchD_0063e806_caseD_2:
  return 0;
}

Assistant:

static int on_frame_recv(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct cf_h2_ctx *ctx = cf->ctx;
  struct Curl_easy *data = CF_DATA_CURRENT(cf), *data_s;
  int32_t stream_id = frame->hd.stream_id;

  DEBUGASSERT(data);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  if(Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] <- %s",frame->hd.stream_id, buffer);
  }
#endif /* !CURL_DISABLE_VERBOSE_STRINGS */

  if(!stream_id) {
    /* stream ID zero is for connection-oriented stuff */
    DEBUGASSERT(data);
    switch(frame->hd.type) {
    case NGHTTP2_SETTINGS: {
      if(!(frame->hd.flags & NGHTTP2_FLAG_ACK)) {
        uint32_t max_conn = ctx->max_concurrent_streams;
        ctx->max_concurrent_streams = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS);
        ctx->enable_push = nghttp2_session_get_remote_settings(
            session, NGHTTP2_SETTINGS_ENABLE_PUSH) != 0;
        CURL_TRC_CF(data, cf, "[0] MAX_CONCURRENT_STREAMS: %d",
                    ctx->max_concurrent_streams);
        CURL_TRC_CF(data, cf, "[0] ENABLE_PUSH: %s",
                    ctx->enable_push ? "TRUE" : "false");
        if(data && max_conn != ctx->max_concurrent_streams) {
          /* only signal change if the value actually changed */
          CURL_TRC_CF(data, cf, "[0] notify MAX_CONCURRENT_STREAMS: %u",
                      ctx->max_concurrent_streams);
          Curl_multi_connchanged(data->multi);
        }
        /* Since the initial stream window is 64K, a request might be on HOLD,
         * due to exhaustion. The (initial) SETTINGS may announce a much larger
         * window and *assume* that we treat this like a WINDOW_UPDATE. Some
         * servers send an explicit WINDOW_UPDATE, but not all seem to do that.
         * To be safe, we UNHOLD a stream in order not to stall. */
        if(CURL_WANT_SEND(data)) {
          struct stream_ctx *stream = H2_STREAM_CTX(data);
          if(stream)
            drain_stream(cf, data, stream);
        }
      }
      break;
    }
    case NGHTTP2_GOAWAY:
      ctx->goaway = TRUE;
      ctx->goaway_error = frame->goaway.error_code;
      ctx->last_stream_id = frame->goaway.last_stream_id;
      if(data) {
        infof(data, "received GOAWAY, error=%d, last_stream=%u",
                    ctx->goaway_error, ctx->last_stream_id);
        Curl_multi_connchanged(data->multi);
      }
      break;
    default:
      break;
    }
    return 0;
  }

  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s) {
    CURL_TRC_CF(data, cf, "[%d] No Curl_easy associated", stream_id);
    return 0;
  }

  return on_stream_frame(cf, data_s, frame)? NGHTTP2_ERR_CALLBACK_FAILURE : 0;
}